

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

float theta_kl(lda *l,v_array<float> *Elogtheta,float *gamma)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  long in_RDX;
  v_array<float> *in_RSI;
  lda *in_RDI;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  size_t k_1;
  float kl;
  float digammasum;
  size_t k;
  float gammasum;
  lda *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  float fVar8;
  float local_5c;
  float local_4c;
  ulong local_40;
  float local_34;
  ulong local_28;
  float local_1c;
  
  local_1c = 0.0;
  v_array<float>::clear
            ((v_array<float> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  for (local_28 = 0; local_28 < in_RDI->topics; local_28 = local_28 + 1) {
    lda::digamma(in_stack_ffffffffffffff78,0.0);
    v_array<float>::push_back
              ((v_array<float> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (float *)in_stack_ffffffffffffff78);
    local_1c = *(float *)(in_RDX + local_28 * 4) + local_1c;
  }
  fVar4 = lda::digamma(in_stack_ffffffffffffff78,0.0);
  dVar5 = lda::lgamma(in_RDI,(double)(ulong)(uint)local_1c);
  local_4c = (float)in_RDI->topics;
  dVar6 = lda::lgamma(in_RDI,(double)(ulong)(uint)in_RDI->lda_alpha);
  local_5c = (float)in_RDI->topics;
  dVar7 = lda::lgamma(in_RDI,(double)(ulong)(uint)(in_RDI->lda_alpha * local_5c));
  local_34 = (SUB84(dVar7,0) - SUB84(dVar5,0)) + -(local_4c * SUB84(dVar6,0));
  for (local_40 = 0; local_40 < in_RDI->topics; local_40 = local_40 + 1) {
    fVar8 = fVar4;
    pfVar3 = v_array<float>::operator[](in_RSI,local_40);
    *pfVar3 = *pfVar3 - fVar8;
    fVar8 = in_RDI->lda_alpha;
    fVar1 = *(float *)(in_RDX + local_40 * 4);
    pfVar3 = v_array<float>::operator[](in_RSI,local_40);
    fVar2 = *pfVar3;
    dVar5 = lda::lgamma(in_RDI,(double)(ulong)*(uint *)(in_RDX + local_40 * 4));
    local_34 = SUB84(dVar5,0) + (fVar8 - fVar1) * fVar2 + local_34;
  }
  return local_34;
}

Assistant:

float theta_kl(lda &l, v_array<float> &Elogtheta, float *gamma)
{
  float gammasum = 0;
  Elogtheta.clear();
  for (size_t k = 0; k < l.topics; k++)
  {
    Elogtheta.push_back(l.digamma(gamma[k]));
    gammasum += gamma[k];
  }
  float digammasum = l.digamma(gammasum);
  gammasum = l.lgamma(gammasum);
  float kl = -(l.topics * l.lgamma(l.lda_alpha));
  kl += l.lgamma(l.lda_alpha * l.topics) - gammasum;
  for (size_t k = 0; k < l.topics; k++)
  {
    Elogtheta[k] -= digammasum;
    kl += (l.lda_alpha - gamma[k]) * Elogtheta[k];
    kl += l.lgamma(gamma[k]);
  }

  return kl;
}